

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS
ref_phys_yplus_metric_reference_length
          (REF_GRID ref_grid,REF_DBL *metric,REF_DBL mach,REF_DBL re,REF_DBL temperature,
          REF_DBL target,REF_DBL reference_length,REF_INT ldim,REF_DBL *field,REF_DICT ref_dict_bcs)

{
  int iVar1;
  int iVar2;
  REF_DBL RVar3;
  REF_DBL RVar4;
  REF_DBL RVar5;
  REF_STATUS RVar6;
  REF_BOOL RVar7;
  uint uVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double local_2f8;
  double local_2f0;
  double local_2e8;
  double local_2e0;
  double local_2d0;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_INT node1;
  REF_INT node0;
  REF_INT edge;
  REF_EDGE ref_edge;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_DBL sr;
  REF_DBL st;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rxs;
  REF_DBL logm [6];
  REF_DBL m [6];
  REF_DBL d [12];
  REF_DBL ratio;
  REF_DBL h1;
  REF_DBL h0;
  REF_DBL diff;
  REF_DBL l0;
  REF_DBL mh;
  REF_DBL h;
  REF_DBL edg_norm [3];
  int local_148 [2];
  REF_INT edg_nodes [27];
  int local_d0;
  REF_INT local_cc;
  REF_INT edg;
  REF_INT bc;
  REF_CELL edg_cell;
  int local_b8;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_INT ref_malloc_init_i_2;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL equilateral_altitude;
  REF_DBL yplus1;
  REF_DBL reference_lengthscale;
  REF_DBL reynolds_number;
  REF_INT i;
  REF_INT node;
  REF_INT *hits;
  REF_DBL *new_log_metric;
  REF_DBL *lengthscale;
  REF_NODE ref_node;
  REF_DICT ref_dict_bcs_local;
  REF_DBL *field_local;
  REF_DBL RStack_48;
  REF_INT ldim_local;
  REF_DBL reference_length_local;
  REF_DBL target_local;
  REF_DBL temperature_local;
  REF_DBL re_local;
  REF_DBL mach_local;
  REF_DBL *metric_local;
  REF_GRID ref_grid_local;
  
  lengthscale = (REF_DBL *)ref_grid->node;
  _ref_malloc_init_i = 0.866025403784439;
  reference_lengthscale = re * reference_length;
  ref_node = (REF_NODE)ref_dict_bcs;
  ref_dict_bcs_local = (REF_DICT)field;
  field_local._4_4_ = ldim;
  RStack_48 = reference_length;
  reference_length_local = target;
  target_local = temperature;
  temperature_local = re;
  re_local = mach;
  mach_local = (REF_DBL)metric;
  metric_local = (REF_DBL *)ref_grid;
  ref_malloc_init_i_1 = ref_phys_minspac(reference_lengthscale,&equilateral_altitude);
  if (ref_malloc_init_i_1 == 0) {
    yplus1 = equilateral_altitude / RStack_48;
    if (*(int *)((long)lengthscale + 4) < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x4a9,
             "ref_phys_yplus_metric_reference_length","malloc hits of REF_INT negative");
      ref_grid_local._4_4_ = 1;
    }
    else {
      _i = (REF_INT *)malloc((long)*(int *)((long)lengthscale + 4) << 2);
      if (_i == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x4a9,"ref_phys_yplus_metric_reference_length","malloc hits of REF_INT NULL");
        ref_grid_local._4_4_ = 2;
      }
      else {
        for (ref_malloc_init_i_2 = 0; ref_malloc_init_i_2 < *(int *)((long)lengthscale + 4);
            ref_malloc_init_i_2 = ref_malloc_init_i_2 + 1) {
          _i[ref_malloc_init_i_2] = 0;
        }
        if (*(int *)((long)lengthscale + 4) * 6 < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x4aa,"ref_phys_yplus_metric_reference_length",
                 "malloc new_log_metric of REF_DBL negative");
          ref_grid_local._4_4_ = 1;
        }
        else {
          hits = (REF_INT *)malloc((long)(*(int *)((long)lengthscale + 4) * 6) << 3);
          if (hits == (REF_INT *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x4aa,"ref_phys_yplus_metric_reference_length",
                   "malloc new_log_metric of REF_DBL NULL");
            ref_grid_local._4_4_ = 2;
          }
          else {
            for (ref_private_macro_code_rss_1 = 0;
                SBORROW4(ref_private_macro_code_rss_1,*(int *)((long)lengthscale + 4) * 6) !=
                ref_private_macro_code_rss_1 + *(int *)((long)lengthscale + 4) * -6 < 0;
                ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
              (hits + (long)ref_private_macro_code_rss_1 * 2)[0] = 0;
              (hits + (long)ref_private_macro_code_rss_1 * 2)[1] = 0;
            }
            if (*(int *)((long)lengthscale + 4) < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x4ab,"ref_phys_yplus_metric_reference_length",
                     "malloc lengthscale of REF_DBL negative");
              ref_grid_local._4_4_ = 1;
            }
            else {
              new_log_metric = (REF_DBL *)malloc((long)*(int *)((long)lengthscale + 4) << 3);
              if (new_log_metric == (REF_DBL *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                       ,0x4ab,"ref_phys_yplus_metric_reference_length",
                       "malloc lengthscale of REF_DBL NULL");
                ref_grid_local._4_4_ = 2;
              }
              else {
                for (local_b8 = 0; local_b8 < *(int *)((long)lengthscale + 4);
                    local_b8 = local_b8 + 1) {
                  new_log_metric[local_b8] = 0.0;
                }
                edg_cell._4_4_ =
                     ref_phys_yplus_lengthscale
                               ((REF_GRID)metric_local,re_local,temperature_local,target_local,
                                field_local._4_4_,(REF_DBL *)ref_dict_bcs_local,new_log_metric);
                if (edg_cell._4_4_ == 0) {
                  if (*(int *)(metric_local + 0x21) == 0) {
                    ref_private_macro_code_rss_7 = 6;
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                           ,0x4ef,"ref_phys_yplus_metric_reference_length",6,"implement 3D");
                    ref_grid_local._4_4_ = ref_private_macro_code_rss_7;
                  }
                  else {
                    _edg = (REF_CELL)metric_local[2];
                    edg_cell._4_4_ = 0;
                    for (local_d0 = 0; local_d0 < _edg->max; local_d0 = local_d0 + 1) {
                      RVar6 = ref_cell_nodes(_edg,local_d0,local_148);
                      if (RVar6 == 0) {
                        local_cc = -1;
                        st._4_4_ = ref_dict_value((REF_DICT)ref_node,local_148[_edg->node_per],
                                                  &local_cc);
                        if ((st._4_4_ != 0) && (st._4_4_ != 5)) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                 ,0x4b9,"ref_phys_yplus_metric_reference_length",(ulong)st._4_4_,
                                 "bc");
                          return st._4_4_;
                        }
                        RVar7 = ref_phys_wall_distance_bc(local_cc);
                        if (RVar7 != 0) {
                          st._0_4_ = ref_layer_interior_seg_normal
                                               ((REF_GRID)metric_local,local_d0,&h);
                          RVar5 = edg_norm[1];
                          RVar4 = edg_norm[0];
                          RVar3 = h;
                          if (st._0_4_ != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                   ,0x4bb,"ref_phys_yplus_metric_reference_length",(ulong)st._0_4_,
                                   "edge norm");
                            return st._0_4_;
                          }
                          dVar10 = sqrt(edg_norm[1] *
                                        (*(double *)
                                          ((long)mach_local + 0x28 + (long)(local_148[0] * 6) * 8) *
                                         edg_norm[1] +
                                        *(double *)
                                         ((long)mach_local + 0x10 + (long)(local_148[0] * 6) * 8) *
                                        h + *(double *)
                                             ((long)mach_local + 0x20 + (long)(local_148[0] * 6) * 8
                                             ) * edg_norm[0]) +
                                        h * (*(double *)
                                              ((long)mach_local + 0x10 +
                                              (long)(local_148[0] * 6) * 8) * edg_norm[1] +
                                            *(double *)
                                             ((long)mach_local + (long)(local_148[0] * 6) * 8) * h +
                                            *(double *)
                                             ((long)mach_local + 8 + (long)(local_148[0] * 6) * 8) *
                                            edg_norm[0]) +
                                        edg_norm[0] *
                                        (*(double *)
                                          ((long)mach_local + 0x20 + (long)(local_148[0] * 6) * 8) *
                                         edg_norm[1] +
                                        *(double *)
                                         ((long)mach_local + 8 + (long)(local_148[0] * 6) * 8) * h +
                                        *(double *)
                                         ((long)mach_local + 0x18 + (long)(local_148[0] * 6) * 8) *
                                        edg_norm[0]));
                          dVar11 = sqrt(edg_norm[1] *
                                        (*(double *)
                                          ((long)mach_local + 0x28 + (long)(local_148[1] * 6) * 8) *
                                         edg_norm[1] +
                                        *(double *)
                                         ((long)mach_local + 0x10 + (long)(local_148[1] * 6) * 8) *
                                        h + *(double *)
                                             ((long)mach_local + 0x20 + (long)(local_148[1] * 6) * 8
                                             ) * edg_norm[0]) +
                                        h * (*(double *)
                                              ((long)mach_local + 0x10 +
                                              (long)(local_148[1] * 6) * 8) * edg_norm[1] +
                                            *(double *)
                                             ((long)mach_local + (long)(local_148[1] * 6) * 8) * h +
                                            *(double *)
                                             ((long)mach_local + 8 + (long)(local_148[1] * 6) * 8) *
                                            edg_norm[0]) +
                                        edg_norm[0] *
                                        (*(double *)
                                          ((long)mach_local + 0x20 + (long)(local_148[1] * 6) * 8) *
                                         edg_norm[1] +
                                        *(double *)
                                         ((long)mach_local + 8 + (long)(local_148[1] * 6) * 8) * h +
                                        *(double *)
                                         ((long)mach_local + 0x18 + (long)(local_148[1] * 6) * 8) *
                                        edg_norm[0]));
                          local_2e0 = (new_log_metric[local_148[0]] + new_log_metric[local_148[1]])
                                      * 0.5;
                          if (local_2e0 - yplus1 <= 0.0) {
                            local_2d0 = -(local_2e0 - yplus1);
                          }
                          else {
                            local_2d0 = local_2e0 - yplus1;
                          }
                          local_2d0 = local_2d0 / yplus1;
                          if (yplus1 <= local_2e0) {
                            local_2e0 = yplus1;
                          }
                          if (local_2d0 - 0.1 <= 0.0) {
                            local_2e8 = 0.0;
                          }
                          else {
                            local_2e8 = local_2d0 - 0.1;
                          }
                          if (1.0 <= local_2e8 / 0.1) {
                            local_2f8 = 1.0;
                          }
                          else {
                            if (local_2d0 - 0.1 <= 0.0) {
                              local_2f0 = 0.0;
                            }
                            else {
                              local_2f0 = local_2d0 - 0.1;
                            }
                            local_2f8 = local_2f0 / 0.1;
                          }
                          _ref_private_macro_code_rss_4 = local_2f8;
                          sr = 1.0 - local_2f8;
                          dVar10 = sr * ((reference_length_local * local_2e0) / _ref_malloc_init_i)
                                   + local_2f8 * (1.0 / ((dVar10 + dVar11) * 0.5));
                          m[5] = 1.0 / (dVar10 * dVar10);
                          dVar10 = RVar5 * 0.0 + -(RVar4 * 1.0);
                          dVar11 = RVar3 * 1.0 + -(RVar5 * 0.0);
                          dVar12 = RVar4 * 0.0 + -(RVar3 * 0.0);
                          sqrt(dVar12 * (*(double *)
                                          ((long)mach_local + 0x28 + (long)(local_148[0] * 6) * 8) *
                                         dVar12 + *(double *)
                                                   ((long)mach_local + 0x10 +
                                                   (long)(local_148[0] * 6) * 8) * dVar10 +
                                                  *(double *)
                                                   ((long)mach_local + 0x20 +
                                                   (long)(local_148[0] * 6) * 8) * dVar11) +
                               dVar10 * (*(double *)
                                          ((long)mach_local + 0x10 + (long)(local_148[0] * 6) * 8) *
                                         dVar12 + *(double *)
                                                   ((long)mach_local + (long)(local_148[0] * 6) * 8)
                                                  * dVar10 +
                                                  *(double *)
                                                   ((long)mach_local + 8 +
                                                   (long)(local_148[0] * 6) * 8) * dVar11) +
                               dVar11 * (*(double *)
                                          ((long)mach_local + 0x20 + (long)(local_148[0] * 6) * 8) *
                                         dVar12 + *(double *)
                                                   ((long)mach_local + 8 +
                                                   (long)(local_148[0] * 6) * 8) * dVar10 +
                                                  *(double *)
                                                   ((long)mach_local + 0x18 +
                                                   (long)(local_148[0] * 6) * 8) * dVar11));
                          sqrt(dVar12 * (*(double *)
                                          ((long)mach_local + 0x28 + (long)(local_148[1] * 6) * 8) *
                                         dVar12 + *(double *)
                                                   ((long)mach_local + 0x10 +
                                                   (long)(local_148[1] * 6) * 8) * dVar10 +
                                                  *(double *)
                                                   ((long)mach_local + 0x20 +
                                                   (long)(local_148[1] * 6) * 8) * dVar11) +
                               dVar10 * (*(double *)
                                          ((long)mach_local + 0x10 + (long)(local_148[1] * 6) * 8) *
                                         dVar12 + *(double *)
                                                   ((long)mach_local + (long)(local_148[1] * 6) * 8)
                                                  * dVar10 +
                                                  *(double *)
                                                   ((long)mach_local + 8 +
                                                   (long)(local_148[1] * 6) * 8) * dVar11) +
                               dVar11 * (*(double *)
                                          ((long)mach_local + 0x20 + (long)(local_148[1] * 6) * 8) *
                                         dVar12 + *(double *)
                                                   ((long)mach_local + 8 +
                                                   (long)(local_148[1] * 6) * 8) * dVar10 +
                                                  *(double *)
                                                   ((long)mach_local + 0x18 +
                                                   (long)(local_148[1] * 6) * 8) * dVar11));
                          ref_private_macro_code_rss_5 = ref_matrix_form_m(m + 5,logm + 5);
                          if (ref_private_macro_code_rss_5 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                   ,0x4e3,"ref_phys_yplus_metric_reference_length",
                                   (ulong)(uint)ref_private_macro_code_rss_5,"form");
                            return ref_private_macro_code_rss_5;
                          }
                          ref_private_macro_code_rss_6 =
                               ref_matrix_log_m(logm + 5,(REF_DBL *)&ref_private_macro_code_rss_2);
                          if (ref_private_macro_code_rss_6 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                   ,0x4e4,"ref_phys_yplus_metric_reference_length",
                                   (ulong)(uint)ref_private_macro_code_rss_6,"form");
                            return ref_private_macro_code_rss_6;
                          }
                          for (reynolds_number._0_4_ = 0; reynolds_number._0_4_ < 6;
                              reynolds_number._0_4_ = reynolds_number._0_4_ + 1) {
                            lVar9 = (long)(reynolds_number._0_4_ + local_148[0] * 6);
                            *(double *)(hits + lVar9 * 2) =
                                 *(double *)
                                  (&ref_private_macro_code_rss_2 + (long)reynolds_number._0_4_ * 2)
                                 + *(double *)(hits + lVar9 * 2);
                          }
                          _i[local_148[0]] = _i[local_148[0]] + 1;
                          for (reynolds_number._0_4_ = 0; reynolds_number._0_4_ < 6;
                              reynolds_number._0_4_ = reynolds_number._0_4_ + 1) {
                            lVar9 = (long)(reynolds_number._0_4_ + local_148[1] * 6);
                            *(double *)(hits + lVar9 * 2) =
                                 *(double *)
                                  (&ref_private_macro_code_rss_2 + (long)reynolds_number._0_4_ * 2)
                                 + *(double *)(hits + lVar9 * 2);
                          }
                          _i[local_148[1]] = _i[local_148[1]] + 1;
                          ref_private_macro_code_rss_6 = 0;
                        }
                      }
                    }
                    ref_private_macro_code_rss_8 =
                         ref_node_ghost_dbl((REF_NODE)lengthscale,(REF_DBL *)hits,6);
                    if (ref_private_macro_code_rss_8 == 0) {
                      ref_edge._4_4_ = ref_node_ghost_int((REF_NODE)lengthscale,_i,1);
                      if (ref_edge._4_4_ == 0) {
                        ref_edge._4_4_ = 0;
                        for (reynolds_number._4_4_ = 0;
                            reynolds_number._4_4_ < *(int *)((long)lengthscale + 4);
                            reynolds_number._4_4_ = reynolds_number._4_4_ + 1) {
                          if ((((-1 < reynolds_number._4_4_) &&
                               (reynolds_number._4_4_ < *(int *)((long)lengthscale + 4))) &&
                              (-1 < *(long *)((long)lengthscale[2] + (long)reynolds_number._4_4_ * 8
                                             ))) && (0 < _i[reynolds_number._4_4_])) {
                            for (reynolds_number._0_4_ = 0; reynolds_number._0_4_ < 6;
                                reynolds_number._0_4_ = reynolds_number._0_4_ + 1) {
                              lVar9 = (long)(reynolds_number._0_4_ + reynolds_number._4_4_ * 6);
                              *(double *)(hits + lVar9 * 2) =
                                   *(double *)(hits + lVar9 * 2) / (double)_i[reynolds_number._4_4_]
                              ;
                            }
                            _i[reynolds_number._4_4_] = -1;
                            ref_edge._0_4_ =
                                 ref_matrix_exp_m((REF_DBL *)
                                                  (hits + (long)(reynolds_number._4_4_ * 6) * 2),
                                                  (REF_DBL *)
                                                  ((long)mach_local +
                                                  (long)(reynolds_number._4_4_ * 6) * 8));
                            if ((uint)ref_edge != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                     ,0x4fc,"ref_phys_yplus_metric_reference_length",
                                     (ulong)(uint)ref_edge,"form");
                              return (uint)ref_edge;
                            }
                            ref_edge._0_4_ = 0;
                          }
                        }
                        uVar8 = ref_edge_create((REF_EDGE *)&node0,(REF_GRID)metric_local);
                        if (uVar8 == 0) {
                          for (node1 = 0; node1 < _node0->n; node1 = node1 + 1) {
                            iVar1 = _node0->e2n[node1 << 1];
                            iVar2 = _node0->e2n[node1 * 2 + 1];
                            if ((-1 < _i[iVar1]) && (_i[iVar2] == -1)) {
                              for (reynolds_number._0_4_ = 0; reynolds_number._0_4_ < 6;
                                  reynolds_number._0_4_ = reynolds_number._0_4_ + 1) {
                                lVar9 = (long)(reynolds_number._0_4_ + iVar1 * 6);
                                *(double *)(hits + lVar9 * 2) =
                                     *(double *)
                                      (hits + (long)(reynolds_number._0_4_ + iVar2 * 6) * 2) +
                                     *(double *)(hits + lVar9 * 2);
                              }
                              _i[iVar1] = _i[iVar1] + 1;
                            }
                            if ((-1 < _i[iVar2]) && (_i[iVar1] == -1)) {
                              for (reynolds_number._0_4_ = 0; reynolds_number._0_4_ < 6;
                                  reynolds_number._0_4_ = reynolds_number._0_4_ + 1) {
                                lVar9 = (long)(reynolds_number._0_4_ + iVar2 * 6);
                                *(double *)(hits + lVar9 * 2) =
                                     *(double *)
                                      (hits + (long)(reynolds_number._0_4_ + iVar1 * 6) * 2) +
                                     *(double *)(hits + lVar9 * 2);
                              }
                              _i[iVar2] = _i[iVar2] + 1;
                            }
                          }
                          ref_edge_free(_node0);
                          uVar8 = ref_node_ghost_dbl((REF_NODE)lengthscale,(REF_DBL *)hits,6);
                          if (uVar8 == 0) {
                            uVar8 = ref_node_ghost_int((REF_NODE)lengthscale,_i,1);
                            if (uVar8 == 0) {
                              for (reynolds_number._4_4_ = 0;
                                  reynolds_number._4_4_ < *(int *)((long)lengthscale + 4);
                                  reynolds_number._4_4_ = reynolds_number._4_4_ + 1) {
                                if ((((-1 < reynolds_number._4_4_) &&
                                     (reynolds_number._4_4_ < *(int *)((long)lengthscale + 4))) &&
                                    (-1 < *(long *)((long)lengthscale[2] +
                                                   (long)reynolds_number._4_4_ * 8))) &&
                                   (0 < _i[reynolds_number._4_4_])) {
                                  for (reynolds_number._0_4_ = 0; reynolds_number._0_4_ < 6;
                                      reynolds_number._0_4_ = reynolds_number._0_4_ + 1) {
                                    lVar9 = (long)(reynolds_number._0_4_ + reynolds_number._4_4_ * 6
                                                  );
                                    *(double *)(hits + lVar9 * 2) =
                                         *(double *)(hits + lVar9 * 2) /
                                         (double)_i[reynolds_number._4_4_];
                                  }
                                  _i[reynolds_number._4_4_] = -2;
                                  uVar8 = ref_matrix_exp_m((REF_DBL *)
                                                           (hits + (long)(reynolds_number._4_4_ * 6)
                                                                   * 2),
                                                           (REF_DBL *)
                                                           ((long)mach_local +
                                                           (long)(reynolds_number._4_4_ * 6) * 8));
                                  if (uVar8 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                           ,0x521,"ref_phys_yplus_metric_reference_length",
                                           (ulong)uVar8,"form");
                                    return uVar8;
                                  }
                                }
                              }
                              uVar8 = ref_node_ghost_dbl((REF_NODE)lengthscale,(REF_DBL *)mach_local
                                                         ,6);
                              if (uVar8 == 0) {
                                if (new_log_metric != (REF_DBL *)0x0) {
                                  free(new_log_metric);
                                }
                                if (hits != (REF_INT *)0x0) {
                                  free(hits);
                                }
                                if (_i != (REF_INT *)0x0) {
                                  free(_i);
                                }
                                ref_grid_local._4_4_ = 0;
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                       ,0x525,"ref_phys_yplus_metric_reference_length",(ulong)uVar8,
                                       "ghost metric");
                                ref_grid_local._4_4_ = uVar8;
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                     ,0x518,"ref_phys_yplus_metric_reference_length",(ulong)uVar8,
                                     "ghost hits");
                              ref_grid_local._4_4_ = uVar8;
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                   ,0x517,"ref_phys_yplus_metric_reference_length",(ulong)uVar8,
                                   "ghost metric");
                            ref_grid_local._4_4_ = uVar8;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                 ,0x503,"ref_phys_yplus_metric_reference_length",(ulong)uVar8,
                                 "orig edges");
                          ref_grid_local._4_4_ = uVar8;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                               ,0x4f3,"ref_phys_yplus_metric_reference_length",(ulong)ref_edge._4_4_
                               ,"ghost hits");
                        ref_grid_local._4_4_ = ref_edge._4_4_;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                             ,0x4f2,"ref_phys_yplus_metric_reference_length",
                             (ulong)(uint)ref_private_macro_code_rss_8,"ghost metric");
                      ref_grid_local._4_4_ = ref_private_macro_code_rss_8;
                    }
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                         ,0x4ae,"ref_phys_yplus_metric_reference_length",(ulong)edg_cell._4_4_,
                         "length scale");
                  ref_grid_local._4_4_ = edg_cell._4_4_;
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x4a6,
           "ref_phys_yplus_metric_reference_length",(ulong)(uint)ref_malloc_init_i_1,"minspac");
    ref_grid_local._4_4_ = ref_malloc_init_i_1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_phys_yplus_metric_reference_length(
    REF_GRID ref_grid, REF_DBL *metric, REF_DBL mach, REF_DBL re,
    REF_DBL temperature, REF_DBL target, REF_DBL reference_length, REF_INT ldim,
    REF_DBL *field, REF_DICT ref_dict_bcs) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *lengthscale, *new_log_metric;
  REF_INT *hits;
  REF_INT node, i;
  REF_DBL reynolds_number, reference_lengthscale, yplus1;
  REF_DBL equilateral_altitude =
      0.866025403784439; /* sqrt(3.0)/2 altitude of equalateral triangle */

  reynolds_number = re * reference_length;
  RSS(ref_phys_minspac(reynolds_number, &yplus1), "minspac");
  reference_lengthscale = yplus1 / reference_length;

  ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);
  ref_malloc_init(new_log_metric, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(lengthscale, ref_node_max(ref_node), REF_DBL, 0.0);
  RSS(ref_phys_yplus_lengthscale(ref_grid, mach, re, temperature, ldim, field,
                                 lengthscale),
      "length scale");
  if (ref_grid_twod(ref_grid)) {
    REF_CELL edg_cell = ref_grid_edg(ref_grid);
    REF_INT bc;
    REF_INT edg, edg_nodes[REF_CELL_MAX_SIZE_PER];
    REF_DBL edg_norm[3], h, mh, l0, diff, h0, h1, ratio;
    REF_DBL d[12], m[6], logm[6];
    each_ref_cell_valid_cell_with_nodes(edg_cell, edg, edg_nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict_bcs, edg_nodes[ref_cell_id_index(edg_cell)],
                         &bc),
          REF_NOT_FOUND, "bc");
      if (!ref_phys_wall_distance_bc(bc)) continue;
      RSS(ref_layer_interior_seg_normal(ref_grid, edg, edg_norm), "edge norm");
      ref_matrix_vec(d, 0, 0) = edg_norm[0];
      ref_matrix_vec(d, 1, 0) = edg_norm[1];
      ref_matrix_vec(d, 2, 0) = edg_norm[2];
      ratio =
          0.5 * (ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[0]]), edg_norm) +
                 ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[1]]), edg_norm));
      mh = 1.0 / ratio;

      l0 = 0.5 * (lengthscale[edg_nodes[0]] + lengthscale[edg_nodes[1]]);

      diff = ABS(l0 - reference_lengthscale) / reference_lengthscale;

      h0 = target * MIN(l0, reference_lengthscale) / equilateral_altitude;
      {
        REF_DBL st, sr;
        sr = MIN(MAX(diff - 0.1, 0.0) / 0.1, 1.0);
        st = 1.0 - sr;
        h = st * h0 + sr * mh;
        /*
        printf("x %.2f l0 %0.5e ref %0.5e diff %.2f sr %.2f st %.2f\n",
               ref_node_xyz(ref_node, 0, edg_nodes[0]), l0,
               reference_lengthscale, diff, sr, st);
        */
      }
      ref_matrix_eig(d, 0) = 1.0 / (h * h);

      ref_matrix_vec(d, 0, 2) = 0.0;
      ref_matrix_vec(d, 1, 2) = 0.0;
      ref_matrix_vec(d, 2, 2) = 1.0;
      ref_matrix_eig(d, 2) = 1.0;

      ref_math_cross_product(ref_matrix_vec_ptr(d, 2), ref_matrix_vec_ptr(d, 0),
                             ref_matrix_vec_ptr(d, 1));
      ratio = 0.5 * (ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[0]]),
                                            ref_matrix_vec_ptr(d, 1)) +
                     ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[1]]),
                                            ref_matrix_vec_ptr(d, 1)));
      h1 = 1.0 / ratio;
      ref_matrix_eig(d, 1) = 1.0 / (h1 * h1);
      RSS(ref_matrix_form_m(d, m), "form");
      RSS(ref_matrix_log_m(m, logm), "form");
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * edg_nodes[0]] += logm[i];
      }
      hits[edg_nodes[0]] += 1;
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * edg_nodes[1]] += logm[i];
      }
      hits[edg_nodes[1]] += 1;
    }
  } else {
    RSS(REF_IMPLEMENT, "implement 3D");
  }

  RSS(ref_node_ghost_dbl(ref_node, new_log_metric, 6), "ghost metric");
  RSS(ref_node_ghost_int(ref_node, hits, 1), "ghost hits");

  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * node] /= (REF_DBL)hits[node];
      }
      hits[node] = -1;
      RSS(ref_matrix_exp_m(&(new_log_metric[6 * node]), &(metric[6 * node])),
          "form");
    }
  }

  {
    REF_EDGE ref_edge;
    REF_INT edge, node0, node1;
    RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");
    for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
      node0 = ref_edge_e2n(ref_edge, 0, edge);
      node1 = ref_edge_e2n(ref_edge, 1, edge);
      if (0 <= hits[node0] && -1 == hits[node1]) {
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node0] += new_log_metric[i + 6 * node1];
        }
        hits[node0] += 1;
      }
      if (0 <= hits[node1] && -1 == hits[node0]) {
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node1] += new_log_metric[i + 6 * node0];
        }
        hits[node1] += 1;
      }
    }
    ref_edge_free(ref_edge);
  }

  RSS(ref_node_ghost_dbl(ref_node, new_log_metric, 6), "ghost metric");
  RSS(ref_node_ghost_int(ref_node, hits, 1), "ghost hits");

  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * node] /= (REF_DBL)hits[node];
      }
      hits[node] = -2;
      RSS(ref_matrix_exp_m(&(new_log_metric[6 * node]), &(metric[6 * node])),
          "form");
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, metric, 6), "ghost metric");

  ref_free(lengthscale);
  ref_free(new_log_metric);
  ref_free(hits);
  return REF_SUCCESS;
}